

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_3::traverseProgramVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,Program *program,string *path,VariableSearchFilter *filter)

{
  Shader *pSVar1;
  pointer pVVar2;
  size_t sVar3;
  long lVar4;
  size_type __n;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *pvVar5;
  bool bVar6;
  int iVar7;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar8;
  pointer pVVar9;
  char *pcVar10;
  char *extraout_RDX;
  char *nameWithPath;
  char *nameWithPath_00;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  _Alloc_hider _Var16;
  byte bVar17;
  pointer pIVar18;
  long lVar19;
  Data __s2;
  bool bVar20;
  string blockMemeberName;
  string blockMemeberName_1;
  string blockName;
  bool local_f9;
  string local_c0;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  Data local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  Program *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  Data local_40;
  undefined4 local_38;
  
  pvVar8 = ProgramInterfaceDefinition::Program::getShaders(program);
  if ((int)((ulong)((long)(pvVar8->
                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar8->
                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
    return false;
  }
  lVar13 = 0;
  local_a0 = typePath;
  local_50 = program;
LAB_01695ed3:
  pvVar8 = ProgramInterfaceDefinition::Program::getShaders(program);
  pSVar1 = (pvVar8->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar13];
  if ((filter->m_shaderTypeBits >> (pSVar1->m_shaderType & 0x1f) & 1) != 0) {
    pVVar2 = (typePath->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((typePath->
        super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
        )._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
      (typePath->
      super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
      )._M_impl.super__Vector_impl_data._M_finish = pVVar2;
    }
    pcVar10 = *(char **)&(pSVar1->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl;
    pVVar9 = *(pointer *)
              ((long)&(pSVar1->m_defaultBlock).variables.
                      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              + 8);
    if (0 < (int)((ulong)((long)pVVar9 - (long)pcVar10) >> 5) * -0x55555555) {
      lVar11 = 0;
      lVar19 = 0;
      do {
        if ((filter->m_storageBits >> (*(uint *)(pcVar10 + lVar11 + 0x18) & 0x1f) & 1) != 0) {
          bVar6 = traverseVariablePath(typePath,path,(VariableDeclaration *)(pcVar10 + lVar11));
          if (bVar6) {
            return true;
          }
          pcVar10 = *(char **)&(pSVar1->m_defaultBlock).variables.
                               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                               ._M_impl;
          pVVar9 = *(pointer *)
                    ((long)&(pSVar1->m_defaultBlock).variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                    + 8);
        }
        lVar19 = lVar19 + 1;
        lVar11 = lVar11 + 0x60;
      } while (lVar19 < (int)((ulong)((long)pVVar9 - (long)pcVar10) >> 5) * -0x55555555);
    }
    glu::parseVariableName_abi_cxx11_(&local_70,(glu *)(path->_M_dataplus)._M_p,pcVar10);
    lVar11 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                       super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                       ._M_impl.super__Vector_impl_data;
    pIVar18 = *(pointer *)
               ((long)&(pSVar1->m_defaultBlock).interfaceBlocks.
                       super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
               + 8);
    if ((int)((ulong)((long)pIVar18 - lVar11) >> 4) * 0x38e38e39 < 1) {
      bVar17 = 0;
    }
    else {
      local_f9 = true;
      lVar19 = 0;
      do {
        pcVar10 = (char *)(lVar19 * 0x90);
        if ((filter->m_storageBits >> (*(uint *)(pcVar10 + lVar11 + 0x14) & 0x1f) & 1) != 0) {
          sVar3 = *(size_t *)(pcVar10 + lVar11 + 0x28);
          nameWithPath = pcVar10;
          if ((sVar3 == local_70._M_string_length) &&
             ((sVar3 == 0 ||
              (iVar7 = bcmp(*(void **)(pcVar10 + lVar11 + 0x20),local_70._M_dataplus._M_p,sVar3),
              nameWithPath = extraout_RDX, iVar7 == 0)))) {
            std::__cxx11::string::substr((ulong)&local_c0,(ulong)path);
            glu::parseVariableName_abi_cxx11_
                      ((string *)&local_90,(glu *)local_c0._M_dataplus._M_p,nameWithPath_00);
            __s2 = local_90;
            lVar11 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                               ._M_impl.super__Vector_impl_data;
            lVar19 = *(long *)(pcVar10 + lVar11 + 0x60);
            uVar14 = (int)(*(long *)(pcVar10 + lVar11 + 0x68) - lVar19 >> 5) * -0x55555555;
            if ((int)uVar14 < 1) goto LAB_01696339;
            local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pcVar10 + lVar11);
            sVar3 = CONCAT44(uStack_84,local_88);
            uVar15 = (ulong)(uVar14 & 0x7fffffff);
            bVar6 = true;
            lVar11 = 0;
            uVar12 = 1;
            goto LAB_016962d1;
          }
          if (*(long *)(pcVar10 + lVar11 + 0x48) == 0) {
            glu::parseVariableName_abi_cxx11_
                      (&local_c0,(glu *)(path->_M_dataplus)._M_p,nameWithPath);
            __n = local_c0._M_string_length;
            lVar11 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                               ._M_impl.super__Vector_impl_data;
            lVar4 = *(long *)(pcVar10 + lVar11 + 0x60);
            uVar14 = (int)(*(long *)(pcVar10 + lVar11 + 0x68) - lVar4 >> 5) * -0x55555555;
            _Var16._M_p = local_c0._M_dataplus._M_p;
            if ((int)uVar14 < 1) {
              bVar6 = false;
              bVar17 = 0;
            }
            else {
              local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pcVar10 + lVar11);
              uVar15 = (ulong)(uVar14 & 0x7fffffff);
              bVar6 = true;
              lVar11 = 0;
              local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_c0._M_dataplus._M_p;
              uVar12 = 1;
              do {
                if ((*(size_t *)(lVar4 + 0x48 + lVar11) == __n) &&
                   ((__n == 0 ||
                    (iVar7 = bcmp(*(void **)(lVar4 + 0x40 + lVar11),_Var16._M_p,__n),
                    _Var16._M_p = (pointer)local_98, iVar7 == 0)))) {
                  pvVar5 = local_a0;
                  local_88 = 1;
                  local_90.type = (VarType *)local_48;
                  std::
                  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                  ::
                  emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
                            (local_a0,(VariablePathComponent *)&local_90);
                  local_f9 = traverseVariablePath
                                       (pvVar5,path,
                                        (VariableDeclaration *)
                                        (lVar11 + *(long *)(pcVar10 +
                                                           *(long *)&(pSVar1->m_defaultBlock).
                                                                     interfaceBlocks.
                                                                                                                                          
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                                  ._M_impl.super__Vector_impl_data + 0x60)));
                  bVar17 = 1;
                  _Var16._M_p = local_c0._M_dataplus._M_p;
                  goto LAB_01696181;
                }
                bVar6 = uVar12 < uVar15;
                lVar11 = lVar11 + 0x60;
                bVar20 = uVar12 != uVar15;
                uVar12 = uVar12 + 1;
              } while (bVar20);
              bVar6 = false;
              bVar17 = 0;
            }
LAB_01696181:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var16._M_p != &local_c0.field_2) {
              operator_delete(_Var16._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if (bVar6) goto LAB_016961cf;
            lVar11 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                               ._M_impl.super__Vector_impl_data;
            pIVar18 = *(pointer *)
                       ((long)&(pSVar1->m_defaultBlock).interfaceBlocks.
                               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                       + 8);
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < (int)((ulong)((long)pIVar18 - lVar11) >> 4) * 0x38e38e39);
      bVar17 = 0;
LAB_016961cf:
      bVar17 = bVar17 & local_f9;
    }
    goto LAB_016961de;
  }
  goto LAB_01696219;
  while( true ) {
    bVar6 = uVar12 < uVar15;
    lVar11 = lVar11 + 0x60;
    bVar20 = uVar12 == uVar15;
    uVar12 = uVar12 + 1;
    if (bVar20) break;
LAB_016962d1:
    if ((*(size_t *)(lVar19 + 0x48 + lVar11) == sVar3) &&
       ((sVar3 == 0 ||
        (iVar7 = bcmp(*(void **)(lVar19 + 0x40 + lVar11),__s2.type,sVar3), iVar7 == 0)))) {
      pvVar5 = local_a0;
      local_38 = 1;
      local_40.type = (VarType *)local_98;
      std::
      vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
      ::emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
                (local_a0,(VariablePathComponent *)&local_40);
      bVar20 = traverseVariablePath
                         (pvVar5,&local_c0,
                          (VariableDeclaration *)
                          (lVar11 + *(long *)(pcVar10 +
                                             *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                                                                                              
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                                  ._M_impl.super__Vector_impl_data + 0x60)));
      bVar17 = bVar6 & bVar20;
      __s2 = local_90;
      goto LAB_016963a7;
    }
  }
LAB_01696339:
  bVar17 = 0;
LAB_016963a7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s2.type != &local_80) {
    operator_delete(__s2.type,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
LAB_016961de:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  typePath = local_a0;
  program = local_50;
  if (bVar17 != 0) {
    return true;
  }
LAB_01696219:
  lVar13 = lVar13 + 1;
  pvVar8 = ProgramInterfaceDefinition::Program::getShaders(program);
  if ((int)((ulong)((long)(pvVar8->
                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar8->
                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar13) {
    return false;
  }
  goto LAB_01695ed3;
}

Assistant:

static bool traverseProgramVariablePath (std::vector<VariablePathComponent>& typePath, const ProgramInterfaceDefinition::Program* program, const std::string& path, const VariableSearchFilter& filter)
{
	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* shader = program->getShaders()[shaderNdx];

		if (filter.matchesFilter(shader))
		{
			// \note modifying output variable even when returning false
			typePath.clear();
			if (traverseShaderVariablePath(typePath, shader, path, filter))
				return true;
		}
	}

	return false;
}